

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O2

int mcu8str_is_ascii(mcu8str *str)

{
  char *pcVar1;
  ulong uVar2;
  
  uVar2 = 0;
  do {
    if (str->size == uVar2) {
      return 1;
    }
    pcVar1 = str->c_str + uVar2;
    uVar2 = uVar2 + 1;
  } while (-1 < *pcVar1);
  return 0;
}

Assistant:

int mcu8str_is_ascii( const mcu8str* str )
  {
    const char * it = str->c_str;
    const char * itE = it + str->size;
    for ( ; it!=itE; ++it )
      if ( (unsigned char)(*it) >= 128 )
        return 0;
    return 1;
  }